

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_lock.hpp
# Opt level: O3

void __thiscall
unodb::optimistic_lock::atomic_version_type::write_unlock_and_obsolete(atomic_version_type *this)

{
  ulong uVar1;
  
  uVar1 = (this->version).super___atomic_base<unsigned_long>._M_i;
  if (uVar1 == 1) {
    __assert_fail("!old_lock_word.is_obsolete()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                  ,0x198,
                  "void unodb::optimistic_lock::atomic_version_type::write_unlock_and_obsolete()");
  }
  if ((uVar1 & 2) != 0) {
    (this->version).super___atomic_base<unsigned_long>._M_i = 1;
    if ((this->version).super___atomic_base<unsigned_long>._M_i == 1) {
      return;
    }
    __assert_fail("load_relaxed().is_obsolete()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                  ,0x19f,
                  "void unodb::optimistic_lock::atomic_version_type::write_unlock_and_obsolete()");
  }
  __assert_fail("old_lock_word.is_write_locked()",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                ,0x199,
                "void unodb::optimistic_lock::atomic_version_type::write_unlock_and_obsolete()");
}

Assistant:

void write_unlock_and_obsolete() noexcept {
#ifndef NDEBUG
      const auto old_lock_word{load_relaxed()};
      UNODB_DETAIL_ASSERT(!old_lock_word.is_obsolete());
      UNODB_DETAIL_ASSERT(old_lock_word.is_write_locked());
#endif

      version.store(version_type::obsolete_lock_word,
                    std::memory_order_release);

      UNODB_DETAIL_ASSERT(load_relaxed().is_obsolete());
    }